

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_set_decoded_components
                   (opj_j2k_t *p_j2k,OPJ_UINT32 numcomps,OPJ_UINT32 *comps_indices,
                   opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_image_t *poVar2;
  void *ptr;
  OPJ_UINT32 *__dest;
  char *fmt;
  OPJ_BOOL OVar3;
  ulong uVar4;
  size_t size;
  
  if (p_j2k->m_private_image == (opj_image_t *)0x0) {
    OVar3 = 0;
    opj_event_msg(p_manager,1,
                  "opj_read_header() should be called before opj_set_decoded_components().\n");
  }
  else {
    ptr = opj_calloc(4,(ulong)p_j2k->m_private_image->numcomps);
    OVar3 = 0;
    if (ptr != (void *)0x0) {
      if (numcomps != 0) {
        poVar2 = p_j2k->m_private_image;
        uVar4 = 0;
        do {
          uVar1 = comps_indices[uVar4];
          if (poVar2->numcomps <= uVar1) {
            fmt = "Invalid component index: %u\n";
LAB_00111901:
            opj_event_msg(p_manager,1,fmt);
            opj_free(ptr);
            return 0;
          }
          if (*(int *)((long)ptr + (ulong)uVar1 * 4) != 0) {
            fmt = "Component index %u used several times\n";
            goto LAB_00111901;
          }
          *(undefined4 *)((long)ptr + (ulong)uVar1 * 4) = 1;
          uVar4 = uVar4 + 1;
        } while (numcomps != uVar4);
      }
      opj_free(ptr);
      opj_free((p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode);
      if (numcomps == 0) {
        (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode = (OPJ_UINT32 *)0x0;
      }
      else {
        size = (ulong)numcomps << 2;
        __dest = (OPJ_UINT32 *)opj_malloc(size);
        (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode = __dest;
        if (__dest == (OPJ_UINT32 *)0x0) {
          (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode = 0;
          return 0;
        }
        memcpy(__dest,comps_indices,size);
      }
      (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode = numcomps;
      OVar3 = 1;
    }
  }
  return OVar3;
}

Assistant:

OPJ_BOOL opj_j2k_set_decoded_components(opj_j2k_t *p_j2k,
                                        OPJ_UINT32 numcomps,
                                        const OPJ_UINT32* comps_indices,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_BOOL* already_mapped;

    if (p_j2k->m_private_image == NULL) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "opj_read_header() should be called before "
                      "opj_set_decoded_components().\n");
        return OPJ_FALSE;
    }

    already_mapped = (OPJ_BOOL*) opj_calloc(sizeof(OPJ_BOOL),
                                            p_j2k->m_private_image->numcomps);
    if (already_mapped == NULL) {
        return OPJ_FALSE;
    }

    for (i = 0; i < numcomps; i++) {
        if (comps_indices[i] >= p_j2k->m_private_image->numcomps) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Invalid component index: %u\n",
                          comps_indices[i]);
            opj_free(already_mapped);
            return OPJ_FALSE;
        }
        if (already_mapped[comps_indices[i]]) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Component index %u used several times\n",
                          comps_indices[i]);
            opj_free(already_mapped);
            return OPJ_FALSE;
        }
        already_mapped[comps_indices[i]] = OPJ_TRUE;
    }
    opj_free(already_mapped);

    opj_free(p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode);
    if (numcomps) {
        p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode =
            (OPJ_UINT32*) opj_malloc(numcomps * sizeof(OPJ_UINT32));
        if (p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode == NULL) {
            p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode = 0;
            return OPJ_FALSE;
        }
        memcpy(p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode,
               comps_indices,
               numcomps * sizeof(OPJ_UINT32));
    } else {
        p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode = NULL;
    }
    p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode = numcomps;

    return OPJ_TRUE;
}